

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

char * cmFileAPI::ObjectKindName(ObjectKind kind)

{
  return ObjectKindName::objectKindNames[(int)kind];
}

Assistant:

const char* cmFileAPI::ObjectKindName(ObjectKind kind)
{
  // Keep in sync with ObjectKind enum.
  static const char* objectKindNames[] = {
    "codemodel",  //
    "cache",      //
    "cmakeFiles", //
    "__test"      //
  };
  return objectKindNames[size_t(kind)];
}